

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O3

void __thiscall
glslang::HlslParseContext::growGlobalUniformBlock
          (HlslParseContext *this,TSourceLoc *loc,TType *memberType,TString *memberName,
          TTypeList *newTypeList)

{
  _Rb_tree_header *p_Var1;
  ulong uVar2;
  TTypeList *pTVar3;
  int iVar4;
  undefined4 extraout_var;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  long lVar5;
  
  iVar4 = (*memberType->_vptr_TType[10])(memberType);
  lVar5 = CONCAT44(extraout_var,iVar4);
  uVar2 = *(ulong *)(lVar5 + 8);
  p_Var7 = (_Base_ptr)0x0;
  p_Var6 = (_Base_ptr)(ulong)(((uint)uVar2 & 0xff80) << 9);
  if ((uVar2 & 0x1ff0000) != 0) {
    p_Var6 = p_Var7;
  }
  *(ulong *)(lVar5 + 8) = uVar2 & 0xffffc01f1fff007f | (ulong)p_Var6;
  *(ulong *)(lVar5 + 0x1c) = *(ulong *)(lVar5 + 0x1c) & 0xffffffff8000 | 0xffff000000004fff;
  *(uint *)(lVar5 + 0x24) = *(uint *)(lVar5 + 0x24) | 0x7fffffff;
  iVar4 = (*memberType->_vptr_TType[0x25])(memberType);
  if ((char)iVar4 != '\0') {
    iVar4 = (*memberType->_vptr_TType[0x25])(memberType);
    if ((char)iVar4 == '\0') {
      __assert_fail("isStruct()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                    ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
    }
    p_Var7 = (this->ioTypeMap).
             super_map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
             ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var7 != (_Base_ptr)0x0) {
      pTVar3 = (memberType->field_13).structure;
      p_Var1 = &(this->ioTypeMap).
                super_map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
                ._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = &p_Var1->_M_header;
      do {
        if (*(TTypeList **)(p_Var7 + 1) >= pTVar3) {
          p_Var6 = p_Var7;
        }
        p_Var7 = (&p_Var7->_M_left)[*(TTypeList **)(p_Var7 + 1) < pTVar3];
      } while (p_Var7 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var6 != p_Var1) && (*(TTypeList **)(p_Var6 + 1) <= pTVar3)) {
        p_Var7 = p_Var6[1]._M_right;
        goto LAB_00403748;
      }
    }
    p_Var7 = (_Base_ptr)0x0;
  }
LAB_00403748:
  TParseContextBase::growGlobalUniformBlock
            (&this->super_TParseContextBase,loc,memberType,memberName,(TTypeList *)p_Var7);
  return;
}

Assistant:

void HlslParseContext::growGlobalUniformBlock(const TSourceLoc& loc, TType& memberType, const TString& memberName,
                                              TTypeList* newTypeList)
{
    newTypeList = nullptr;
    correctUniform(memberType.getQualifier());
    if (memberType.isStruct()) {
        auto it = ioTypeMap.find(memberType.getStruct());
        if (it != ioTypeMap.end() && it->second.uniform)
            newTypeList = it->second.uniform;
    }
    TParseContextBase::growGlobalUniformBlock(loc, memberType, memberName, newTypeList);
}